

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::bootstrap(RpcConnectionState *this)

{
  uint *puVar1;
  undefined8 *puVar2;
  SourceLocation location;
  Refcounted *refcounted;
  Question *pQVar3;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar4;
  RpcConnectionState *in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar5;
  ArrayPtr<const_capnp::PipelineOp> ops;
  QuestionId questionId;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> questionRef;
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  paf;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t> pipeline;
  undefined8 uStack_200;
  Builder local_1d0;
  Builder builder;
  
  if ((in_RSI->connection).tag == 2) {
    kj::Exception::Exception((Exception *)&builder,(Exception *)&(in_RSI->connection).field_1);
    newBrokenCap((capnp *)this,(Exception *)&builder);
    kj::Exception::~Exception((Exception *)&builder);
    pCVar4 = extraout_RDX;
  }
  else {
    setNotIdle(in_RSI);
    pQVar3 = anon_unknown_18::
             ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
                       (&in_RSI->questions,&questionId);
    pQVar3->isAwaitingReturn = true;
    location.function = (char *)pipeline.ptr;
    location.fileName = (char *)pipeline.disposer;
    location._16_8_ = uStack_200;
    kj::
    newPromiseAndFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
              (location);
    kj::
    refcounted<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,capnp::_::RpcSystemBase::RpcConnectionState&,unsigned_int&,kj::Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>,decltype(nullptr)>>
              ((kj *)&questionRef,in_RSI,&questionId,&paf.fulfiller);
    (pQVar3->selfRef).ptr = questionRef.ptr;
    puVar1 = &((questionRef.ptr)->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    builder._builder.segment = (SegmentBuilder *)questionRef.ptr;
    builder._builder.capTable = (CapTableBuilder *)questionRef.ptr;
    kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
    ::attach<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
              ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
                *)&pipeline,
               (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)&paf
              );
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&paf,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&pipeline);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&pipeline);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::dispose
              ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
               &builder);
    puVar2 = *(undefined8 **)((long)&(in_RSI->connection).field_1 + 0x10);
    (**(code **)*puVar2)(&message,puVar2,5);
    (**(message.ptr)->_vptr_OutgoingRpcMessage)(&local_1d0);
    AnyPointer::Builder::initAs<capnp::rpc::Message>
              ((BuilderFor<capnp::rpc::Message> *)&pipeline,&local_1d0);
    rpc::Message::Builder::initBootstrap(&builder,(Builder *)&pipeline);
    *(QuestionId *)builder._builder.data = questionId;
    (*(message.ptr)->_vptr_OutgoingRpcMessage[2])();
    kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::dispose(&message);
    kj::
    refcounted<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
              ((kj *)&pipeline,in_RSI,&questionRef,&paf.promise);
    builder._builder.segment = (SegmentBuilder *)0x0;
    builder._builder.capTable = (CapTableBuilder *)0x0;
    builder._builder.data = (void *)0x0;
    ops.size_ = 0;
    ops.ptr = (PipelineOp *)pipeline.ptr;
    RpcPipeline::getPipelinedCap((RpcPipeline *)this,ops);
    kj::Array<const_capnp::PipelineOp>::~Array((Array<const_capnp::PipelineOp> *)&builder);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline,_std::nullptr_t>::dispose
              (&pipeline);
    kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::dispose
              (&questionRef);
    kj::
    PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
    ::~PromiseFulfillerPair(&paf);
    pCVar4 = extraout_RDX_00;
  }
  OVar5.ptr = pCVar4;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<ClientHook> bootstrap() {
    if (connection.is<Disconnected>()) {
      return newBrokenCap(kj::cp(connection.get<Disconnected>()));
    }

    setNotIdle();

    QuestionId questionId;
    auto& question = questions.next(questionId);

    question.isAwaitingReturn = true;

    auto paf = kj::newPromiseAndFulfiller<kj::Promise<kj::Own<RpcResponse>>>();

    auto questionRef = kj::refcounted<QuestionRef>(*this, questionId, kj::mv(paf.fulfiller));
    question.selfRef = *questionRef;

    paf.promise = paf.promise.attach(kj::addRef(*questionRef));

    {
      auto message = connection.get<Connected>().connection->newOutgoingMessage(
          messageSizeHint<rpc::Bootstrap>());

      auto builder = message->getBody().initAs<rpc::Message>().initBootstrap();
      builder.setQuestionId(questionId);
      message->send();
    }

    auto pipeline = kj::refcounted<RpcPipeline>(*this, kj::mv(questionRef), kj::mv(paf.promise));

    return pipeline->getPipelinedCap(kj::Array<const PipelineOp>(nullptr));
  }